

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particles.cpp
# Opt level: O2

void __thiscall CParticles::CParticles(CParticles *this)

{
  (this->super_CComponent)._vptr_CComponent = (_func_int **)&PTR__CParticles_00207828;
  (this->m_RenderTrail).super_CComponent._vptr_CComponent = (_func_int **)&PTR__CComponent_002078c0;
  (this->m_RenderExplosions).super_CComponent._vptr_CComponent =
       (_func_int **)&PTR__CComponent_00207958;
  (this->m_RenderGeneral).super_CComponent._vptr_CComponent =
       (_func_int **)&PTR__CComponent_002079f0;
  OnReset(this);
  (this->m_RenderTrail).m_pParts = this;
  (this->m_RenderExplosions).m_pParts = this;
  (this->m_RenderGeneral).m_pParts = this;
  return;
}

Assistant:

CParticles::CParticles()
{
	OnReset();
	m_RenderTrail.m_pParts = this;
	m_RenderExplosions.m_pParts = this;
	m_RenderGeneral.m_pParts = this;
}